

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

void __thiscall
FIX::ScreenLog::ScreenLog
          (ScreenLog *this,SessionID *sessionID,bool incoming,bool outgoing,bool event)

{
  pointer pcVar1;
  undefined8 local_40;
  int64_t iStack_38;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_001f9270;
  (this->m_prefix)._M_dataplus._M_p = (pointer)&(this->m_prefix).field_2;
  pcVar1 = (sessionID->m_frozenString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_prefix,pcVar1,pcVar1 + (sessionID->m_frozenString)._M_string_length)
  ;
  DateTime::nowUtc();
  (this->m_time).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8600;
  *(undefined8 *)&(this->m_time).super_DateTime.m_date = local_40;
  (this->m_time).super_DateTime.m_time = iStack_38;
  (this->m_time).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8898;
  this->m_incoming = incoming;
  this->m_outgoing = outgoing;
  this->m_event = event;
  return;
}

Assistant:

ScreenLog(const SessionID &sessionID, bool incoming, bool outgoing, bool event)
      : m_prefix(sessionID.toString()),
        m_incoming(incoming),
        m_outgoing(outgoing),
        m_event(event) {}